

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O2

void __thiscall
midi_container::trim_tempo_map
          (midi_container *this,unsigned_long p_index,unsigned_long base_timestamp)

{
  pointer ptVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  ptVar1 = (this->m_tempo_map).super__Vector_base<tempo_map,_std::allocator<tempo_map>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (p_index < (ulong)(((long)(this->m_tempo_map).
                               super__Vector_base<tempo_map,_std::allocator<tempo_map>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)ptVar1) / 0x18)) {
    puVar2 = *(ulong **)
              &ptVar1[p_index].m_entries.
               super__Vector_base<tempo_entry,_std::allocator<tempo_entry>_>._M_impl;
    lVar3 = (long)*(pointer *)
                   ((long)&ptVar1[p_index].m_entries.
                           super__Vector_base<tempo_entry,_std::allocator<tempo_entry>_>._M_impl + 8
                   ) - (long)puVar2 >> 4;
    while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
      uVar4 = *puVar2 - base_timestamp;
      if (*puVar2 < base_timestamp) {
        uVar4 = 0;
      }
      *puVar2 = uVar4;
      puVar2 = puVar2 + 2;
    }
  }
  return;
}

Assistant:

void midi_container::trim_tempo_map( unsigned long p_index, unsigned long base_timestamp )
{
    if ( p_index < m_tempo_map.size() )
    {
        tempo_map & map = m_tempo_map[ p_index ];

        for ( unsigned long i = 0, j = map.get_count(); i < j; ++i )
        {
            tempo_entry & entry = map[ i ];
            if ( entry.m_timestamp >= base_timestamp )
                entry.m_timestamp -= base_timestamp;
            else
                entry.m_timestamp = 0;
        }
    }
}